

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

uint16_t mpack_node_u16(mpack_node_t node)

{
  mpack_type_t mVar1;
  ulong uVar2;
  
  if ((node.tree)->error == mpack_ok) {
    mVar1 = (node.data)->type;
    if (((mVar1 != mpack_type_int) && (mVar1 != mpack_type_uint)) ||
       (uVar2 = ((node.data)->value).u, 0xffff < uVar2)) {
      mpack_tree_flag_error(node.tree,mpack_error_type);
      return 0;
    }
  }
  else {
    uVar2 = 0;
  }
  return (uint16_t)uVar2;
}

Assistant:

MPACK_INLINE uint16_t mpack_node_u16(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= UINT16_MAX)
            return (uint16_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= 0 && node.data->value.i <= UINT16_MAX)
            return (uint16_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}